

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

int event_add_nolock_(event *ev,timeval *tv,int tv_is_absolute)

{
  timeval *ptVar1;
  event_base *base;
  unsigned_long uVar2;
  short *psVar3;
  event_callback *peVar4;
  void *pvVar5;
  void *pvVar6;
  event *peVar7;
  long *plVar8;
  long lVar9;
  __suseconds_t _Var10;
  ushort uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  event **ppeVar16;
  unsigned_long uVar17;
  ulong uVar18;
  event_debug_entry *peVar19;
  char *pcVar20;
  long lVar21;
  long lVar22;
  uint u;
  event_callback *peVar23;
  event ***pppeVar24;
  char *pcVar25;
  char *pcVar26;
  char *pcVar27;
  uint uVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  timeval now;
  timeval local_48;
  
  base = ev->ev_base;
  if (((base->th_base_lock == (void *)0x0) || (evthread_lock_debugging_enabled_ == 0)) ||
     (iVar12 = evthread_is_debug_lock_held_(base->th_base_lock), iVar12 != 0)) {
    event_debug_assert_is_setup_(ev);
    if (event_debug_logging_mask_ != 0) {
      uVar11 = ev->ev_events;
      pcVar20 = "EV_READ ";
      if ((uVar11 & 2) == 0) {
        pcVar20 = " ";
      }
      pcVar25 = "EV_WRITE ";
      if ((uVar11 & 4) == 0) {
        pcVar25 = " ";
      }
      pcVar26 = "EV_CLOSED ";
      if (-1 < (char)uVar11) {
        pcVar26 = " ";
      }
      pcVar27 = "EV_TIMEOUT ";
      if (tv == (timeval *)0x0) {
        pcVar27 = " ";
      }
      event_debugx_("event_add: event: %p (fd %d), %s%s%s%scall %p",ev,(ulong)(uint)ev->ev_fd,
                    pcVar20,pcVar25,pcVar26,pcVar27,(ev->ev_evcallback).evcb_cb_union.evcb_callback)
      ;
    }
    uVar11 = (ev->ev_evcallback).evcb_flags;
    if (0xff < uVar11) {
      event_add_nolock__cold_1();
LAB_00248f2e:
      event_add_nolock__cold_5();
      goto LAB_00248f33;
    }
    if ((uVar11 & 0x40) != 0) {
      return -1;
    }
    if ((uVar11 & 1) == 0 && tv != (timeval *)0x0) {
      uVar15 = (base->timeheap).a;
      uVar13 = (base->timeheap).n + 1;
      if (uVar15 < uVar13) {
        uVar28 = 8;
        if (uVar15 != 0) {
          uVar28 = uVar15 * 2;
        }
        if (uVar28 <= uVar13) {
          uVar28 = uVar13;
        }
        ppeVar16 = (base->timeheap).p;
        if (mm_realloc_fn_ == (_func_void_ptr_void_ptr_size_t *)0x0) {
          ppeVar16 = (event **)realloc(ppeVar16,(ulong)uVar28 * 8);
        }
        else {
          ppeVar16 = (event **)(*mm_realloc_fn_)(ppeVar16,(ulong)uVar28 * 8);
        }
        if (ppeVar16 == (event **)0x0) {
          return -1;
        }
        (base->timeheap).p = ppeVar16;
        (base->timeheap).a = uVar28;
      }
    }
    if ((((event *)base->current_event == ev) &&
        (evthread_id_fn_ != (_func_unsigned_long *)0x0 && (ev->ev_events & 8) != 0)) &&
       (uVar2 = base->th_owner_id, uVar17 = (*evthread_id_fn_)(), uVar2 != uVar17)) {
      base->current_event_waiters = base->current_event_waiters + 1;
      if (base->current_event_cond != (void *)0x0) {
        (*evthread_cond_fns_.wait_condition)
                  (base->current_event_cond,base->th_base_lock,(timeval *)0x0);
      }
    }
    uVar11 = ev->ev_events;
    bVar29 = false;
    if ((uVar11 & 0x8e) == 0) {
      iVar12 = 0;
LAB_00248a5e:
      if (tv == (timeval *)0x0) goto LAB_00248e71;
      if ((tv_is_absolute == 0) && ((ev->ev_evcallback).evcb_closure == '\x02')) {
        _Var10 = tv->tv_usec;
        (ev->ev_).ev_io.ev_timeout.tv_sec = tv->tv_sec;
        (ev->ev_).ev_io.ev_timeout.tv_usec = _Var10;
      }
      uVar11 = (ev->ev_evcallback).evcb_flags;
      if ((uVar11 & 1) != 0) {
        event_queue_remove_timeout(base,ev);
        uVar11 = (ev->ev_evcallback).evcb_flags;
      }
      if (((uVar11 & 8) != 0) && ((ev->ev_res & 1) != 0)) {
        if (((ev->ev_events & 8) != 0) &&
           (((ev->ev_).ev_signal.ev_ncalls != 0 &&
            (psVar3 = (ev->ev_).ev_signal.ev_pncalls, psVar3 != (short *)0x0)))) {
          *psVar3 = 0;
        }
        event_queue_remove_active(base,&ev->ev_evcallback);
      }
      gettime(base,&now);
      uVar15 = (uint)tv->tv_usec;
      if ((uVar15 & 0xf0000000) == 0x50000000) {
        uVar13 = (uint)((ulong)tv->tv_usec >> 0x14) & 0xff;
        bVar32 = (int)uVar13 < base->n_common_timeouts;
        if (tv_is_absolute == 0) {
          if (base->n_common_timeouts <= (int)uVar13) goto LAB_00248cf1;
          lVar21 = now.tv_sec + tv->tv_sec;
          (ev->ev_timeout).tv_sec = lVar21;
          uVar18 = (ulong)(uVar15 & 0xfffff) + now.tv_usec;
          (ev->ev_timeout).tv_usec = uVar18;
          if (999999 < (long)uVar18) {
            (ev->ev_timeout).tv_sec = lVar21 + 1;
            uVar18 = uVar18 - 1000000;
            (ev->ev_timeout).tv_usec = uVar18;
          }
          (ev->ev_timeout).tv_usec = tv->tv_usec & 0xfffffffffff00000U | uVar18;
          bVar32 = false;
        }
        else {
LAB_00248b12:
          _Var10 = tv->tv_usec;
          (ev->ev_timeout).tv_sec = tv->tv_sec;
          (ev->ev_timeout).tv_usec = _Var10;
          bVar32 = !bVar32;
        }
      }
      else {
        bVar32 = false;
        if (tv_is_absolute != 0) goto LAB_00248b12;
LAB_00248cf1:
        lVar21 = tv->tv_sec + now.tv_sec;
        (ev->ev_timeout).tv_sec = lVar21;
        lVar22 = tv->tv_usec + now.tv_usec;
        (ev->ev_timeout).tv_usec = lVar22;
        bVar32 = true;
        if (999999 < lVar22) {
          (ev->ev_timeout).tv_sec = lVar21 + 1;
          (ev->ev_timeout).tv_usec = lVar22 + -1000000;
        }
      }
      if (event_debug_logging_mask_ != 0) {
        event_debugx_("event_add: event %p, timeout in %d seconds %d useconds, call %p",ev,
                      (ulong)(uint)tv->tv_sec,(ulong)(uint)tv->tv_usec,
                      (ev->ev_evcallback).evcb_cb_union.evcb_callback);
      }
      if (((base->th_base_lock == (void *)0x0) || (evthread_lock_debugging_enabled_ == 0)) ||
         (iVar14 = evthread_is_debug_lock_held_(base->th_base_lock), iVar14 != 0)) {
        uVar11 = (ev->ev_evcallback).evcb_flags;
        if ((uVar11 & 1) == 0) {
          iVar14 = base->event_count + (uint)((uVar11 & 0x10) == 0);
          base->event_count = iVar14;
          if (iVar14 < base->event_count_max) {
            iVar14 = base->event_count_max;
          }
          base->event_count_max = iVar14;
          psVar3 = &(ev->ev_evcallback).evcb_flags;
          *(byte *)psVar3 = (byte)*psVar3 | 1;
          ptVar1 = &ev->ev_timeout;
          uVar18 = (ev->ev_timeout).tv_usec;
          if ((((uint)uVar18 & 0xf0000000) == 0x50000000) &&
             ((int)((uint)(uVar18 >> 0x14) & 0xff) < base->n_common_timeouts)) {
            ppeVar16 = *(event ***)
                        ((long)base->common_timeout_queues + (ulong)((uint)(uVar18 >> 0x11) & 0x7f8)
                        );
            for (peVar4 = *(ppeVar16[1]->ev_evcallback).evcb_active_next.tqe_prev;
                peVar23 = (event_callback *)ppeVar16, peVar4 != (event_callback *)0x0;
                peVar4 = (peVar4[1].evcb_active_next.tqe_prev[1]->evcb_active_next).tqe_next) {
              peVar23 = peVar4[3].evcb_active_next.tqe_next;
              if (0xfffff < ((ulong)peVar23 ^ uVar18)) goto LAB_00248f2e;
              pvVar5 = peVar4[2].evcb_arg;
              pvVar6 = (void *)ptVar1->tv_sec;
              bVar30 = SBORROW8((long)pvVar6,(long)pvVar5);
              lVar21 = (long)pvVar6 - (long)pvVar5;
              if (pvVar6 == pvVar5) {
                bVar30 = SBORROW8(uVar18,(long)peVar23);
                lVar21 = uVar18 - (long)peVar23;
              }
              if (bVar30 == lVar21 < 0) {
                peVar23 = peVar4 + 1;
                break;
              }
            }
            peVar7 = *(event **)&peVar23->evcb_active_next;
            pppeVar24 = &(peVar7->ev_timeout_pos).ev_next_with_common_timeout.tqe_prev;
            if (peVar7 == (event *)0x0) {
              pppeVar24 = (event ***)(ppeVar16 + 1);
            }
            (ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_next = peVar7;
            *pppeVar24 = (event **)&ev->ev_timeout_pos;
            *(event **)&peVar23->evcb_active_next = ev;
            (ev->ev_timeout_pos).ev_next_with_common_timeout.tqe_prev = (event **)peVar23;
          }
          else {
            uVar15 = (base->timeheap).n;
            if (uVar15 != 0xffffffff) {
              uVar13 = (base->timeheap).a;
              if (uVar13 <= uVar15) {
                uVar28 = 8;
                if (uVar13 != 0) {
                  uVar28 = uVar13 * 2;
                }
                if (uVar28 <= uVar15 + 1) {
                  uVar28 = uVar15 + 1;
                }
                ppeVar16 = (base->timeheap).p;
                if (mm_realloc_fn_ == (_func_void_ptr_void_ptr_size_t *)0x0) {
                  ppeVar16 = (event **)realloc(ppeVar16,(ulong)uVar28 * 8);
                }
                else {
                  ppeVar16 = (event **)(*mm_realloc_fn_)(ppeVar16,(ulong)uVar28 * 8);
                }
                if (ppeVar16 == (event **)0x0) goto LAB_00248de7;
                (base->timeheap).p = ppeVar16;
                (base->timeheap).a = uVar28;
                uVar15 = (base->timeheap).n;
              }
              (base->timeheap).n = uVar15 + 1;
              if (uVar15 == 0) {
                uVar18 = 0;
              }
              else {
                do {
                  uVar13 = uVar15 - 1;
                  uVar28 = uVar13 >> 1;
                  uVar18 = (ulong)uVar28;
                  ppeVar16 = (base->timeheap).p;
                  peVar7 = ppeVar16[uVar18];
                  lVar21 = ptVar1->tv_sec;
                  lVar22 = (peVar7->ev_timeout).tv_sec;
                  bVar31 = SBORROW8(lVar22,lVar21);
                  lVar9 = lVar22 - lVar21;
                  bVar30 = lVar22 == lVar21;
                  if (bVar30) {
                    lVar21 = (peVar7->ev_timeout).tv_usec;
                    lVar22 = (ev->ev_timeout).tv_usec;
                    bVar31 = SBORROW8(lVar21,lVar22);
                    lVar9 = lVar21 - lVar22;
                    bVar30 = lVar21 == lVar22;
                  }
                  if (bVar30 || bVar31 != lVar9 < 0) {
                    uVar18 = (ulong)uVar15;
                    break;
                  }
                  ppeVar16[uVar15] = peVar7;
                  (peVar7->ev_timeout_pos).min_heap_idx = uVar15;
                  uVar15 = uVar28;
                } while (1 < uVar13);
              }
              (base->timeheap).p[uVar18] = ev;
              (ev->ev_timeout_pos).min_heap_idx = (int)uVar18;
            }
          }
LAB_00248de7:
          if (bVar32) {
            if ((ev->ev_timeout_pos).min_heap_idx == 0) {
LAB_00248e26:
              bVar29 = true;
            }
            else if (((base->timeheap).n != 0) &&
                    (peVar7 = *(base->timeheap).p, peVar7 != (event *)0x0)) {
              lVar21 = (peVar7->ev_timeout).tv_sec;
              bVar32 = SBORROW8(lVar21,now.tv_sec);
              lVar22 = lVar21 - now.tv_sec;
              if (lVar21 == now.tv_sec) {
                lVar22 = (peVar7->ev_timeout).tv_usec;
                bVar32 = SBORROW8(lVar22,now.tv_usec);
                lVar22 = lVar22 - now.tv_usec;
              }
              if (bVar32 != lVar22 < 0) goto LAB_00248e26;
            }
          }
          else {
            plVar8 = *(long **)((long)base->common_timeout_queues +
                               (ulong)((uint)(ev->ev_timeout).tv_usec >> 0x11 & 0x7f8));
            if ((event *)*plVar8 == ev) {
              local_48.tv_sec = ptVar1->tv_sec;
              local_48.tv_usec = (ev->ev_timeout).tv_usec & 0xfffff;
              event_add_nolock_((event *)(plVar8 + 4),&local_48,1);
            }
          }
LAB_00248e71:
          if ((((bool)(evthread_id_fn_ != (_func_unsigned_long *)0x0 & bVar29)) &&
              (base->running_loop != 0)) &&
             (uVar2 = base->th_owner_id, uVar17 = (*evthread_id_fn_)(), uVar2 != uVar17)) {
            evthread_notify_base(base);
          }
          goto LAB_00248ea9;
        }
        goto LAB_00248f38;
      }
      goto LAB_00248f40;
    }
    iVar12 = 0;
    if (((ev->ev_evcallback).evcb_flags & 0x2a) != 0) goto LAB_00248a5e;
    if ((uVar11 & 0x86) != 0) {
      iVar14 = evmap_io_add_(base,ev->ev_fd,ev);
LAB_002489e1:
      if (iVar14 != -1) goto LAB_002489ed;
      iVar12 = -1;
LAB_00248ea9:
      if (event_debug_mode_on_ == 0) {
        event_debug_mode_too_late = 1;
        return iVar12;
      }
      if (event_debug_map_lock_ != (void *)0x0) {
        (*evthread_lock_fns_.lock)(0,event_debug_map_lock_);
      }
      if (global_debug_map.hth_table != (event_debug_entry **)0x0) {
        peVar19 = (event_debug_entry *)
                  (global_debug_map.hth_table +
                  ((ulong)ev >> 6 & 0x3ffffff) % (ulong)global_debug_map.hth_table_length);
        while (peVar19 = (peVar19->node).hte_next, peVar19 != (event_debug_entry *)0x0) {
          if (peVar19->ptr == ev) {
            peVar19->field_0x10 = peVar19->field_0x10 | 1;
            if (event_debug_map_lock_ == (void *)0x0) {
              event_debug_mode_too_late = 1;
              return iVar12;
            }
            (*evthread_lock_fns_.unlock)(0,event_debug_map_lock_);
            event_debug_mode_too_late = 1;
            return iVar12;
          }
        }
      }
      goto LAB_00248f52;
    }
    iVar14 = 0;
    if ((uVar11 & 8) != 0) {
      iVar14 = evmap_signal_add_(base,ev->ev_fd,ev);
      goto LAB_002489e1;
    }
LAB_002489ed:
    if (((base->th_base_lock == (void *)0x0) || (evthread_lock_debugging_enabled_ == 0)) ||
       (iVar12 = evthread_is_debug_lock_held_(base->th_base_lock), iVar12 != 0)) {
      uVar11 = (ev->ev_evcallback).evcb_flags;
      if ((uVar11 & 2) == 0) {
        iVar12 = base->event_count + (uint)((uVar11 & 0x10) == 0);
        base->event_count = iVar12;
        if (iVar12 < base->event_count_max) {
          iVar12 = base->event_count_max;
        }
        base->event_count_max = iVar12;
        psVar3 = &(ev->ev_evcallback).evcb_flags;
        *(byte *)psVar3 = (byte)*psVar3 | 2;
        bVar29 = iVar14 == 1;
        iVar12 = 0;
        if (!bVar29) {
          iVar12 = iVar14;
        }
        goto LAB_00248a5e;
      }
      goto LAB_00248f45;
    }
  }
  else {
LAB_00248f33:
    event_add_nolock__cold_7();
LAB_00248f38:
    event_add_nolock__cold_4();
LAB_00248f40:
    event_add_nolock__cold_6();
LAB_00248f45:
    event_add_nolock__cold_2();
  }
  event_add_nolock__cold_3();
LAB_00248f52:
  event_errx(-0x21522153,
             "%s: noting an add on a non-setup event %p (events: 0x%x, fd: %d, flags: 0x%x)",
             "event_debug_note_add_",ev,(ulong)(uint)(int)ev->ev_events,(ulong)(uint)ev->ev_fd,
             (ulong)(uint)(int)(ev->ev_evcallback).evcb_flags);
}

Assistant:

int
event_add_nolock_(struct event *ev, const struct timeval *tv,
    int tv_is_absolute)
{
	struct event_base *base = ev->ev_base;
	int res = 0;
	int notify = 0;

	EVENT_BASE_ASSERT_LOCKED(base);
	event_debug_assert_is_setup_(ev);

	event_debug((
		 "event_add: event: %p (fd "EV_SOCK_FMT"), %s%s%s%scall %p",
		 ev,
		 EV_SOCK_ARG(ev->ev_fd),
		 ev->ev_events & EV_READ ? "EV_READ " : " ",
		 ev->ev_events & EV_WRITE ? "EV_WRITE " : " ",
		 ev->ev_events & EV_CLOSED ? "EV_CLOSED " : " ",
		 tv ? "EV_TIMEOUT " : " ",
		 ev->ev_callback));

	EVUTIL_ASSERT(!(ev->ev_flags & ~EVLIST_ALL));

	if (ev->ev_flags & EVLIST_FINALIZING) {
		/* XXXX debug */
		return (-1);
	}

	/*
	 * prepare for timeout insertion further below, if we get a
	 * failure on any step, we should not change any state.
	 */
	if (tv != NULL && !(ev->ev_flags & EVLIST_TIMEOUT)) {
		if (min_heap_reserve_(&base->timeheap,
			1 + min_heap_size_(&base->timeheap)) == -1)
			return (-1);  /* ENOMEM == errno */
	}

	/* If the main thread is currently executing a signal event's
	 * callback, and we are not the main thread, then we want to wait
	 * until the callback is done before we mess with the event, or else
	 * we can race on ev_ncalls and ev_pncalls below. */
#ifndef EVENT__DISABLE_THREAD_SUPPORT
	if (base->current_event == event_to_event_callback(ev) &&
	    (ev->ev_events & EV_SIGNAL)
	    && !EVBASE_IN_THREAD(base)) {
		++base->current_event_waiters;
		EVTHREAD_COND_WAIT(base->current_event_cond, base->th_base_lock);
	}
#endif

	if ((ev->ev_events & (EV_READ|EV_WRITE|EV_CLOSED|EV_SIGNAL)) &&
	    !(ev->ev_flags & (EVLIST_INSERTED|EVLIST_ACTIVE|EVLIST_ACTIVE_LATER))) {
		if (ev->ev_events & (EV_READ|EV_WRITE|EV_CLOSED))
			res = evmap_io_add_(base, ev->ev_fd, ev);
		else if (ev->ev_events & EV_SIGNAL)
			res = evmap_signal_add_(base, (int)ev->ev_fd, ev);
		if (res != -1)
			event_queue_insert_inserted(base, ev);
		if (res == 1) {
			/* evmap says we need to notify the main thread. */
			notify = 1;
			res = 0;
		}
	}

	/*
	 * we should change the timeout state only if the previous event
	 * addition succeeded.
	 */
	if (res != -1 && tv != NULL) {
		struct timeval now;
		int common_timeout;
#ifdef USE_REINSERT_TIMEOUT
		int was_common;
		int old_timeout_idx;
#endif

		/*
		 * for persistent timeout events, we remember the
		 * timeout value and re-add the event.
		 *
		 * If tv_is_absolute, this was already set.
		 */
		if (ev->ev_closure == EV_CLOSURE_EVENT_PERSIST && !tv_is_absolute)
			ev->ev_io_timeout = *tv;

#ifndef USE_REINSERT_TIMEOUT
		if (ev->ev_flags & EVLIST_TIMEOUT) {
			event_queue_remove_timeout(base, ev);
		}
#endif

		/* Check if it is active due to a timeout.  Rescheduling
		 * this timeout before the callback can be executed
		 * removes it from the active list. */
		if ((ev->ev_flags & EVLIST_ACTIVE) &&
		    (ev->ev_res & EV_TIMEOUT)) {
			if (ev->ev_events & EV_SIGNAL) {
				/* See if we are just active executing
				 * this event in a loop
				 */
				if (ev->ev_ncalls && ev->ev_pncalls) {
					/* Abort loop */
					*ev->ev_pncalls = 0;
				}
			}

			event_queue_remove_active(base, event_to_event_callback(ev));
		}

		gettime(base, &now);

		common_timeout = is_common_timeout(tv, base);
#ifdef USE_REINSERT_TIMEOUT
		was_common = is_common_timeout(&ev->ev_timeout, base);
		old_timeout_idx = COMMON_TIMEOUT_IDX(&ev->ev_timeout);
#endif

		if (tv_is_absolute) {
			ev->ev_timeout = *tv;
		} else if (common_timeout) {
			struct timeval tmp = *tv;
			tmp.tv_usec &= MICROSECONDS_MASK;
			evutil_timeradd(&now, &tmp, &ev->ev_timeout);
			ev->ev_timeout.tv_usec |=
			    (tv->tv_usec & ~MICROSECONDS_MASK);
		} else {
			evutil_timeradd(&now, tv, &ev->ev_timeout);
		}

		event_debug((
			 "event_add: event %p, timeout in %d seconds %d useconds, call %p",
			 ev, (int)tv->tv_sec, (int)tv->tv_usec, ev->ev_callback));

#ifdef USE_REINSERT_TIMEOUT
		event_queue_reinsert_timeout(base, ev, was_common, common_timeout, old_timeout_idx);
#else
		event_queue_insert_timeout(base, ev);
#endif

		if (common_timeout) {
			struct common_timeout_list *ctl =
			    get_common_timeout_list(base, &ev->ev_timeout);
			if (ev == TAILQ_FIRST(&ctl->events)) {
				common_timeout_schedule(ctl, &now, ev);
			}
		} else {
			struct event* top = NULL;
			/* See if the earliest timeout is now earlier than it
			 * was before: if so, we will need to tell the main
			 * thread to wake up earlier than it would otherwise.
			 * We double check the timeout of the top element to
			 * handle time distortions due to system suspension.
			 */
			if (min_heap_elt_is_top_(ev))
				notify = 1;
			else if ((top = min_heap_top_(&base->timeheap)) != NULL &&
					 evutil_timercmp(&top->ev_timeout, &now, <))
				notify = 1;
		}
	}

	/* if we are not in the right thread, we need to wake up the loop */
	if (res != -1 && notify && EVBASE_NEED_NOTIFY(base))
		evthread_notify_base(base);

	event_debug_note_add_(ev);

	return (res);
}